

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.cpp
# Opt level: O3

void __thiscall
midi_container::get_meta_data(midi_container *this,unsigned_long subsong,midi_meta_data *p_out)

{
  bool bVar1;
  pointer puVar2;
  byte bVar3;
  uint8_t uVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  ulong uVar5;
  pointer pmVar7;
  pointer pmVar8;
  char *p_value;
  pointer puVar9;
  ulong uVar10;
  unsigned_long uVar11;
  pointer pmVar12;
  pointer puVar13;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string convert;
  char temp [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_118;
  unsigned_long local_100;
  midi_meta_data_item local_f8;
  midi_meta_data *local_b0;
  midi_container *local_a8;
  char *local_a0;
  char *local_98;
  char local_90;
  undefined7 uStack_8f;
  unsigned_long local_80;
  undefined8 local_78;
  ulong local_70;
  unsigned_long local_68;
  pointer local_60;
  char local_58 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  
  local_a0 = &local_90;
  local_98 = (char *)0x0;
  local_90 = '\0';
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pmVar7 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
           super__Vector_impl_data._M_start;
  pmVar8 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pmVar8 != pmVar7) {
    local_78 = 0;
    local_70 = 0;
    uVar11 = 0;
    local_b0 = p_out;
    local_a8 = this;
    local_68 = subsong;
    do {
      if (uVar11 == subsong || this->m_form != 2) {
        local_100 = 0;
        if (this->m_form == 2) {
          local_100 = uVar11;
        }
        pmVar12 = pmVar7[uVar11].m_events.
                  super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (pmVar7[uVar11].m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
            _M_impl.super__Vector_impl_data._M_finish != pmVar12) {
          local_60 = pmVar7 + uVar11;
          uVar5 = 0;
          uVar10 = 1;
          local_80 = uVar11;
          do {
            if (pmVar12[uVar5].m_type != extended) goto switchD_00106c07_caseD_5;
            pmVar12 = pmVar12 + uVar5;
            puVar13 = (pmVar12->m_ext_data).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish +
                      (pmVar12->m_data_count -
                      (long)(pmVar12->m_ext_data).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
            if (pmVar12->m_data[0] == 0xf0 && (puVar13 != (pointer)0x0 && (local_70 & 1) == 0)) {
              bVar3 = pmVar12->m_data[1];
              if (puVar13 < (pointer)0x2) {
                bVar3 = 0;
              }
              uVar5 = 0;
              if (bVar3 < 0x43) {
                if (bVar3 == 0x41) {
                  uVar4 = pmVar12->m_data[3];
                  if (puVar13 < (pointer)0x4) {
                    uVar4 = '\0';
                  }
                  if (uVar4 == '\x14') {
                    p_value = "D-50";
                  }
                  else {
                    p_value = "GS";
                    if (uVar4 != 'B') {
                      if (uVar4 != '\x16') goto switchD_00106c07_caseD_5;
                      p_value = "MT-32";
                    }
                  }
                }
                else {
                  if (bVar3 != 0x42) goto switchD_00106c07_caseD_5;
                  p_value = "X5";
                }
LAB_00107022:
                uVar11 = timestamp_to_ms(this,pmVar12->m_timestamp,local_100);
                midi_meta_data_item::midi_meta_data_item(&local_f8,uVar11,"type",p_value);
                std::vector<midi_meta_data_item,_std::allocator<midi_meta_data_item>_>::push_back
                          (&p_out->m_data,&local_f8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8.m_value._M_dataplus._M_p != &local_f8.m_value.field_2) {
                  operator_delete(local_f8.m_value._M_dataplus._M_p,
                                  local_f8.m_value.field_2._M_allocated_capacity + 1);
                }
                paVar6 = &local_f8.m_name.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8.m_name._M_dataplus._M_p != paVar6) {
                  operator_delete(local_f8.m_name._M_dataplus._M_p,
                                  local_f8.m_name.field_2._M_allocated_capacity + 1);
                  paVar6 = extraout_RAX;
                }
                uVar5 = CONCAT71((int7)((ulong)paVar6 >> 8),1);
                local_70 = uVar5;
              }
              else {
                p_value = "XG";
                if (bVar3 == 0x43) goto LAB_00107022;
                if (bVar3 != 0x7e) goto switchD_00106c07_caseD_5;
              }
              local_78 = CONCAT71((int7)(uVar5 >> 8),1);
            }
            else if ((pmVar12->m_data[0] == 0xff && (pointer)0x1 < puVar13) &&
                    (pmVar12->m_data[1] - 1 < 6)) {
              puVar13 = puVar13 + -2;
              switch((uint)pmVar12->m_data[1]) {
              case 1:
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_118,(size_type)puVar13);
                puVar2 = local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar9 = (pmVar12->m_ext_data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish +
                         (pmVar12->m_data_count -
                         (long)(pmVar12->m_ext_data).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start) + -2;
                if (puVar13 <= puVar9) {
                  puVar9 = puVar13;
                }
                puVar13 = (pointer)0xe;
                if (puVar9 < (pointer)0xe) {
                  puVar13 = puVar9;
                }
                memcpy(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,pmVar12->m_data + 2,(size_t)puVar13)
                ;
                if ((pointer)0xe < puVar9) {
                  memcpy(puVar2 + (long)puVar13,
                         (pmVar12->m_ext_data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,(long)puVar9 - (long)puVar13);
                }
                std::__cxx11::string::replace
                          ((ulong)&local_a0,0,local_98,
                           (ulong)local_118.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                snprintf(local_58,0x1f,"track_text_%02lu",local_80);
                this = local_a8;
                uVar11 = timestamp_to_ms(local_a8,pmVar12->m_timestamp,local_100);
                midi_meta_data_item::midi_meta_data_item(&local_f8,uVar11,local_58,local_a0);
                p_out = local_b0;
                std::vector<midi_meta_data_item,_std::allocator<midi_meta_data_item>_>::push_back
                          (&local_b0->m_data,&local_f8);
                break;
              case 2:
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_118,(size_type)puVar13);
                puVar2 = local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar9 = (pmVar12->m_ext_data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish +
                         (pmVar12->m_data_count -
                         (long)(pmVar12->m_ext_data).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start) + -2;
                if (puVar13 <= puVar9) {
                  puVar9 = puVar13;
                }
                puVar13 = (pointer)0xe;
                if (puVar9 < (pointer)0xe) {
                  puVar13 = puVar9;
                }
                memcpy(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,pmVar12->m_data + 2,(size_t)puVar13)
                ;
                if ((pointer)0xe < puVar9) {
                  memcpy(puVar2 + (long)puVar13,
                         (pmVar12->m_ext_data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,(long)puVar9 - (long)puVar13);
                }
                std::__cxx11::string::replace
                          ((ulong)&local_a0,0,local_98,
                           (ulong)local_118.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                this = local_a8;
                uVar11 = timestamp_to_ms(local_a8,pmVar12->m_timestamp,local_100);
                midi_meta_data_item::midi_meta_data_item(&local_f8,uVar11,"copyright",local_a0);
                p_out = local_b0;
                std::vector<midi_meta_data_item,_std::allocator<midi_meta_data_item>_>::push_back
                          (&local_b0->m_data,&local_f8);
                break;
              default:
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_118,(size_type)puVar13);
                puVar2 = local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar9 = (pmVar12->m_ext_data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish +
                         (pmVar12->m_data_count -
                         (long)(pmVar12->m_ext_data).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start) + -2;
                if (puVar13 <= puVar9) {
                  puVar9 = puVar13;
                }
                puVar13 = (pointer)0xe;
                if (puVar9 < (pointer)0xe) {
                  puVar13 = puVar9;
                }
                memcpy(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,pmVar12->m_data + 2,(size_t)puVar13)
                ;
                if ((pointer)0xe < puVar9) {
                  memcpy(puVar2 + (long)puVar13,
                         (pmVar12->m_ext_data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,(long)puVar9 - (long)puVar13);
                }
                std::__cxx11::string::replace
                          ((ulong)&local_a0,0,local_98,
                           (ulong)local_118.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                snprintf(local_58,0x1f,"track_name_%02lu",local_80);
                this = local_a8;
                uVar11 = timestamp_to_ms(local_a8,pmVar12->m_timestamp,local_100);
                midi_meta_data_item::midi_meta_data_item(&local_f8,uVar11,local_58,local_a0);
                p_out = local_b0;
                std::vector<midi_meta_data_item,_std::allocator<midi_meta_data_item>_>::push_back
                          (&local_b0->m_data,&local_f8);
                break;
              case 5:
                goto switchD_00106c07_caseD_5;
              case 6:
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_118,(size_type)puVar13);
                puVar2 = local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar9 = (pmVar12->m_ext_data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish +
                         (pmVar12->m_data_count -
                         (long)(pmVar12->m_ext_data).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start) + -2;
                if (puVar13 <= puVar9) {
                  puVar9 = puVar13;
                }
                puVar13 = (pointer)0xe;
                if (puVar9 < (pointer)0xe) {
                  puVar13 = puVar9;
                }
                memcpy(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,pmVar12->m_data + 2,(size_t)puVar13)
                ;
                if ((pointer)0xe < puVar9) {
                  memcpy(puVar2 + (long)puVar13,
                         (pmVar12->m_ext_data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,(long)puVar9 - (long)puVar13);
                }
                std::__cxx11::string::replace
                          ((ulong)&local_a0,0,local_98,
                           (ulong)local_118.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                this = local_a8;
                uVar11 = timestamp_to_ms(local_a8,pmVar12->m_timestamp,local_100);
                midi_meta_data_item::midi_meta_data_item(&local_f8,uVar11,"track_marker",local_a0);
                p_out = local_b0;
                std::vector<midi_meta_data_item,_std::allocator<midi_meta_data_item>_>::push_back
                          (&local_b0->m_data,&local_f8);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8.m_value._M_dataplus._M_p != &local_f8.m_value.field_2) {
                operator_delete(local_f8.m_value._M_dataplus._M_p,
                                local_f8.m_value.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8.m_name._M_dataplus._M_p != &local_f8.m_name.field_2) {
                operator_delete(local_f8.m_name._M_dataplus._M_p,
                                local_f8.m_name.field_2._M_allocated_capacity + 1);
              }
            }
switchD_00106c07_caseD_5:
            pmVar12 = (local_60->m_events).
                      super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
                      super__Vector_impl_data._M_start;
            bVar1 = uVar10 < (ulong)((long)(local_60->m_events).
                                           super__Vector_base<midi_event,_std::allocator<midi_event>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pmVar12 >> 6);
            uVar5 = uVar10;
            uVar10 = (ulong)((int)uVar10 + 1);
          } while (bVar1);
          pmVar7 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pmVar8 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          subsong = local_68;
          uVar11 = local_80;
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)(((long)pmVar8 - (long)pmVar7 >> 3) * -0x5555555555555555));
    if (((~(byte)local_78 | (byte)local_70) & 1) == 0) {
      midi_meta_data_item::midi_meta_data_item(&local_f8,0,"type","GM");
      std::vector<midi_meta_data_item,_std::allocator<midi_meta_data_item>_>::push_back
                (&p_out->m_data,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.m_value._M_dataplus._M_p != &local_f8.m_value.field_2) {
        operator_delete(local_f8.m_value._M_dataplus._M_p,
                        local_f8.m_value.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.m_name._M_dataplus._M_p != &local_f8.m_name.field_2) {
        operator_delete(local_f8.m_name._M_dataplus._M_p,
                        local_f8.m_name.field_2._M_allocated_capacity + 1);
      }
    }
  }
  midi_meta_data::append(p_out,&this->m_extra_meta_data);
  if (local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  return;
}

Assistant:

void midi_container::get_meta_data( unsigned long subsong, midi_meta_data & p_out )
{
    char temp[32];
    std::string convert;

    std::vector<uint8_t> data;

    bool type_found = false;
    bool type_non_gm_found = false;

    for ( unsigned long i = 0; i < m_tracks.size(); ++i )
    {
        if ( m_form == 2 && i != subsong ) continue;

        unsigned long tempo_track = 0;
        if ( m_form == 2 ) tempo_track = i;

        const midi_track & track = m_tracks[ i ];
        for ( unsigned j = 0; j < track.get_count(); ++j )
        {
            const midi_event & event = track[ j ];
            if ( event.m_type == midi_event::extended )
            {
                std::size_t data_count = event.get_data_count();
                if ( !type_non_gm_found && data_count >= 1 && event.m_data[ 0 ] == 0xF0 )
                {
                    unsigned char test = 0;
                    unsigned char test2 = 0;
                    if ( data_count > 1 ) test  = event.m_data[ 1 ];
                    if ( data_count > 3 ) test2 = event.m_data[ 3 ];

                    const char * type = NULL;

                    switch( test )
                    {
                    case 0x7E:
                        type_found = true;
                        break;
                    case 0x43:
                        type = "XG";
                        break;
                    case 0x42:
                        type = "X5";
                        break;
                    case 0x41:
                        if ( test2 == 0x42 ) type = "GS";
                        else if ( test2 == 0x16 ) type = "MT-32";
                        else if ( test2 == 0x14 ) type = "D-50";
                    }

                    if ( type )
                    {
                        type_found = true;
                        type_non_gm_found = true;
                        p_out.add_item( midi_meta_data_item( timestamp_to_ms( event.m_timestamp, tempo_track ), "type", type ) );
                    }
                }
                else if ( data_count >= 2 && event.m_data[ 0 ] == 0xFF )
                {
                    data_count -= 2;
                    switch ( event.m_data[ 1 ] )
                    {
                    case 6:
                        data.resize( data_count );
                        event.copy_data( &data[0], 2, data_count );
                        convert_mess_to_utf8( ( const char * ) &data[0], data_count, convert );
                        p_out.add_item( midi_meta_data_item( timestamp_to_ms( event.m_timestamp, tempo_track ), "track_marker", convert.c_str() ) );
                        break;

                    case 2:
                        data.resize( data_count );
                        event.copy_data( &data[0], 2, data_count );
                        convert_mess_to_utf8( ( const char * ) &data[0], data_count, convert );
                        p_out.add_item( midi_meta_data_item( timestamp_to_ms( event.m_timestamp, tempo_track ), "copyright", convert.c_str() ) );
                        break;

                    case 1:
                        data.resize( data_count );
                        event.copy_data( &data[0], 2, data_count );
                        convert_mess_to_utf8( ( const char * ) &data[0], data_count, convert );
                        snprintf(temp, 31, "track_text_%02lu", i);
                        p_out.add_item( midi_meta_data_item( timestamp_to_ms( event.m_timestamp, tempo_track ), temp, convert.c_str() ) );
                        break;

                    case 3:
                    case 4:
                        data.resize( data_count );
                        event.copy_data( &data[0], 2, data_count );
                        convert_mess_to_utf8( ( const char * ) &data[0], data_count, convert );
                        snprintf(temp, 31, "track_name_%02lu", i);
                        p_out.add_item( midi_meta_data_item( timestamp_to_ms( event.m_timestamp, tempo_track ), temp, convert.c_str() ) );
                        break;
                    }
                }
            }
        }
    }

    if ( type_found && !type_non_gm_found )
    {
        p_out.add_item( midi_meta_data_item( 0, "type", "GM" ) );
    }

    p_out.append( m_extra_meta_data );
}